

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O0

big_integer *
anon_unknown.dwarf_998c::merge_all<big_integer>
          (vector<big_integer,_std::allocator<big_integer>_> *v)

{
  bool bVar1;
  size_type sVar2;
  vector<big_integer,_std::allocator<big_integer>_> *in_RSI;
  big_integer *in_RDI;
  big_integer *unaff_retaddr;
  vector<big_integer,_std::allocator<big_integer>_> *in_stack_00000230;
  big_integer *a;
  
  a = in_RDI;
  bVar1 = std::vector<big_integer,_std::allocator<big_integer>_>::empty(in_RSI);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    while (sVar2 = std::vector<big_integer,_std::allocator<big_integer>_>::size(in_RSI), 1 < sVar2)
    {
      merge_two<big_integer>(in_stack_00000230);
    }
    std::vector<big_integer,_std::allocator<big_integer>_>::operator[](in_RSI,0);
    big_integer::big_integer(unaff_retaddr,a);
    return in_RDI;
  }
  __assert_fail("!v.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
                ,0x2ae,"T (anonymous namespace)::merge_all(std::vector<T>) [T = big_integer]");
}

Assistant:

T merge_all(std::vector<T> v)
    {
        assert(!v.empty());

        while (v.size() >= 2)
            merge_two(v);

        return v[0];
    }